

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O2

void __thiscall
timeoutProblems_timeoutFiles_Test::~timeoutProblems_timeoutFiles_Test
          (timeoutProblems_timeoutFiles_Test *this)

{
  testing::Test::~Test
            ((Test *)&this[-1].super_timeoutProblems.super_TestWithParam<int>.super_Test.
                      gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(timeoutProblems, timeoutFiles)
{
    auto cdata = loadFailureFile("timeout", GetParam());
    ASSERT_FALSE(cdata.empty());
    precise_unit val;
    EXPECT_NO_THROW(val = unit_from_string(cdata));
    if (!is_error(val)) {
        auto str = to_string(val);
        auto u2 = unit_from_string(str);
        EXPECT_FALSE(is_error(u2));
    }
}